

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XAtlas_wrap.cxx
# Opt level: O0

void CSharp_XAtlasSharp_SetProgressCallback__SWIG_0(void *jarg1,void *jarg2,void *jarg3)

{
  void *arg3;
  ProgressFunc arg2;
  Atlas *arg1;
  void *jarg3_local;
  void *jarg2_local;
  void *jarg1_local;
  
  xatlas::SetProgressCallback((Atlas *)jarg1,(ProgressFunc)jarg2,jarg3);
  return;
}

Assistant:

SWIGEXPORT void SWIGSTDCALL CSharp_XAtlasSharp_SetProgressCallback__SWIG_0(void * jarg1, void* jarg2, void * jarg3) {
  xatlas::Atlas *arg1 = (xatlas::Atlas *) 0 ;
  xatlas::ProgressFunc arg2 = (xatlas::ProgressFunc) 0 ;
  void *arg3 = (void *) 0 ;
  
  arg1 = (xatlas::Atlas *)jarg1; 
  arg2 = (xatlas::ProgressFunc)jarg2; 
  arg3 = (void *)jarg3; 
  xatlas::SetProgressCallback(arg1,arg2,arg3);
}